

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void container_suite::test_array_bool_one(void)

{
  string local_208 [36];
  undefined4 local_1e4;
  size_type local_1e0;
  undefined4 local_1d4;
  size_type local_1d0;
  undefined4 local_1c4;
  size_type local_1c0 [3];
  undefined1 local_1a8 [8];
  encoder_type encoder;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::detail::basic_encoder<char,24ul>::
  basic_encoder<std::__cxx11::ostringstream>
            ((basic_encoder<char,24ul> *)local_1a8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1c0[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::
                 value<trial::protocol::json::token::begin_array>
                           ((basic_encoder<char,_24UL> *)local_1a8);
  local_1c4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::begin_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x382,"void container_suite::test_array_bool_one()",local_1c0,&local_1c4);
  local_1d0 = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                        ((basic_encoder<char,_24UL> *)local_1a8,false);
  local_1d4 = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(false)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,899,"void container_suite::test_array_bool_one()",&local_1d0,&local_1d4);
  local_1e0 = trial::protocol::json::detail::basic_encoder<char,_24UL>::
              value<trial::protocol::json::token::end_array>((basic_encoder<char,_24UL> *)local_1a8)
  ;
  local_1e4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::end_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,900,"void container_suite::test_array_bool_one()",&local_1e0,&local_1e4);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[8]>
            ("result.str()","\"[false]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x385,"void container_suite::test_array_bool_one()",local_208,"[false]");
  std::__cxx11::string::~string(local_208);
  trial::protocol::json::detail::basic_encoder<char,_24UL>::~basic_encoder
            ((basic_encoder<char,_24UL> *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_array_bool_one()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::begin_array>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(false), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::end_array>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[false]");
}